

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O0

void gdImageGifAnimAddCtx
               (gdImagePtr im,gdIOCtxPtr out,int LocalCM,int LeftOfs,int TopOfs,int Delay,
               int Disposal,gdImagePtr previm)

{
  int GInterlace;
  int iVar1;
  gdImagePtr to;
  int *local_4e8;
  gdImagePtr local_4b0;
  gdImagePtr pim2;
  int colorMap [256];
  int max_y;
  int max_x;
  int min_y;
  int min_x;
  int y;
  int x;
  gdImagePtr prev_tim;
  gdImagePtr prev_pim;
  int local_68;
  int BitsPerPixel;
  int transparent;
  int interlace;
  gdImagePtr tim;
  gdImagePtr pim;
  int Delay_local;
  int TopOfs_local;
  int LeftOfs_local;
  int LocalCM_local;
  gdIOCtxPtr out_local;
  gdImagePtr im_local;
  
  tim = (gdImagePtr)0x0;
  GInterlace = im->interlace;
  local_68 = im->transparent;
  TopOfs_local = LocalCM;
  if (LocalCM < 0) {
    TopOfs_local = 0;
  }
  _transparent = im;
  if ((im->trueColor != 0) &&
     (_transparent = gdImageCreatePaletteFromTrueColor(im,1,0x100), tim = _transparent,
     _transparent == (gdImagePtr)0x0)) {
    return;
  }
  pim._4_4_ = TopOfs;
  Delay_local = LeftOfs;
  if (previm != (gdImagePtr)0x0) {
    prev_tim = (gdImagePtr)0x0;
    _y = previm;
    max_x = 0;
    max_y = _transparent->sy;
    colorMap[0xff] = 0;
    colorMap[0xfe] = 0;
    if ((previm->trueColor != 0) &&
       (_y = gdImageCreatePaletteFromTrueColor(previm,1,0x100), prev_tim = _y, _y == (gdImagePtr)0x0
       )) goto LAB_0011f7fd;
    for (min_x = 0; min_x < 0x100; min_x = min_x + 1) {
      colorMap[(long)min_x + -2] = -2;
    }
    for (min_y = 0; min_y < _transparent->sy; min_y = min_y + 1) {
      for (min_x = 0; min_x < _transparent->sx; min_x = min_x + 1) {
        iVar1 = comparewithmap(_y,_transparent,(uint)_y->pixels[min_y][min_x],
                               (uint)_transparent->pixels[min_y][min_x],(int *)&pim2);
        if (iVar1 == 0) {
          colorMap[0xfe] = min_y;
          max_y = min_y;
          colorMap[0xff] = min_x;
          max_x = min_x;
          goto LAB_0011f268;
        }
      }
    }
LAB_0011f268:
    if (_transparent->sy == max_y) {
      local_68 = 0;
      max_y = 1;
      max_x = 1;
      colorMap[0xfe] = 0;
      colorMap[0xff] = 0;
    }
    else {
      min_y = _transparent->sy;
      while (min_y = min_y + -1, max_y < min_y) {
        for (min_x = 0; min_x < _transparent->sx; min_x = min_x + 1) {
          iVar1 = comparewithmap(_y,_transparent,(uint)_y->pixels[min_y][min_x],
                                 (uint)_transparent->pixels[min_y][min_x],(int *)&pim2);
          if (iVar1 == 0) {
            colorMap[0xfe] = min_y;
            if (min_x < max_x) {
              max_x = min_x;
            }
            if (colorMap[0xff] < min_x) {
              colorMap[0xff] = min_x;
            }
            goto LAB_0011f37a;
          }
        }
      }
LAB_0011f37a:
      for (min_x = 0; min_x < max_x; min_x = min_x + 1) {
        for (min_y = max_y; min_y <= colorMap[0xfe]; min_y = min_y + 1) {
          iVar1 = comparewithmap(_y,_transparent,(uint)_y->pixels[min_y][min_x],
                                 (uint)_transparent->pixels[min_y][min_x],(int *)&pim2);
          if (iVar1 == 0) {
            max_x = min_x;
            goto LAB_0011f415;
          }
        }
      }
LAB_0011f415:
      min_x = _transparent->sx;
      while (min_x = min_x + -1, colorMap[0xff] < min_x) {
        for (min_y = max_y; min_y <= colorMap[0xfe]; min_y = min_y + 1) {
          iVar1 = comparewithmap(_y,_transparent,(uint)_y->pixels[min_y][min_x],
                                 (uint)_transparent->pixels[min_y][min_x],(int *)&pim2);
          if (iVar1 == 0) {
            colorMap[0xff] = min_x;
            goto LAB_0011f4b8;
          }
        }
      }
    }
LAB_0011f4b8:
    Delay_local = max_x;
    pim._4_4_ = max_y;
    Disposal = 1;
    if ((((max_x != 0) || (colorMap[0xff] != _transparent->sx + -1)) || (max_y != 0)) ||
       ((colorMap[0xfe] != _transparent->sy + -1 || (to = tim, -1 < local_68)))) {
      to = gdImageCreate((colorMap[0xff] - max_x) + 1,(colorMap[0xfe] - max_y) + 1);
      if (to == (gdImagePtr)0x0) {
        if (prev_tim != (gdImagePtr)0x0) {
          gdImageDestroy(prev_tim);
        }
        goto LAB_0011f7fd;
      }
      if (TopOfs_local == 0) {
        local_4b0 = _y;
      }
      else {
        local_4b0 = _transparent;
      }
      gdImagePaletteCopy(to,local_4b0);
      gdImageCopy(to,_transparent,0,0,max_x,max_y,(colorMap[0xff] - max_x) + 1,
                  (colorMap[0xfe] - max_y) + 1);
      _transparent = to;
      if (tim != (gdImagePtr)0x0) {
        gdImageDestroy(tim);
      }
    }
    tim = to;
    if (-1 < local_68) {
      for (min_y = 0; min_y < _transparent->sy; min_y = min_y + 1) {
        for (min_x = 0; min_x < _transparent->sx; min_x = min_x + 1) {
          iVar1 = comparewithmap(_y,_transparent,(uint)_y->pixels[max_y + min_y][max_x + min_x],
                                 (uint)_transparent->pixels[min_y][min_x],(int *)0x0);
          if (iVar1 != 0) {
            gdImageSetPixel(_transparent,min_x,min_y,local_68);
            break;
          }
        }
      }
    }
    if (prev_tim != (gdImagePtr)0x0) {
      gdImageDestroy(prev_tim);
    }
  }
  iVar1 = colorstobpp(_transparent->colorsTotal);
  if (TopOfs_local == 0) {
    local_4e8 = (int *)0x0;
  }
  else {
    local_4e8 = _transparent->red;
  }
  GIFAnimEncode(out,_transparent->sx,_transparent->sy,Delay_local,pim._4_4_,GInterlace,local_68,
                Delay,Disposal,iVar1,local_4e8,_transparent->green,_transparent->blue,_transparent);
LAB_0011f7fd:
  if (tim != (gdImagePtr)0x0) {
    gdImageDestroy(tim);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageGifAnimAddCtx(gdImagePtr im, gdIOCtxPtr out,
                                       int LocalCM, int LeftOfs, int TopOfs,
                                       int Delay, int Disposal,
                                       gdImagePtr previm)
{
	gdImagePtr pim = NULL, tim = im;
	int interlace, transparent, BitsPerPixel;
	interlace = im->interlace;
	transparent = im->transparent;

	/* Default is no local color map */
	if(LocalCM < 0) {
		LocalCM = 0;
	}

	if(im->trueColor) {
		/* Expensive, but the only way that produces an
			acceptable result: mix down to a palette
			based temporary image. */
		pim = gdImageCreatePaletteFromTrueColor(im, 1, 256);
		if (!pim) {
			return;
		}
		tim = pim;
	}

	if (previm) {
		/* create optimized animation.  Compare this image to
		   the previous image and crop the temporary copy of
		   current image to include only changed rectangular
		   area.  Also replace unchanged pixels inside this
		   area with transparent color.  Transparent color
		   needs to be already allocated!
		   Preconditions:
		   TopOfs, LeftOfs are assumed 0

		   Images should be of same size.  If not, a temporary
		   copy is made with the same size as previous image.

		*/
		gdImagePtr prev_pim = 0, prev_tim = previm;
		int x, y;
		int min_x = 0;
		int min_y = tim->sy;
		int max_x = 0;
		int max_y = 0;
		int colorMap[256];

		if (previm->trueColor) {
			prev_pim = gdImageCreatePaletteFromTrueColor(previm, 1, 256);
			if (!prev_pim) {
				goto fail_end;
			}
			prev_tim = prev_pim;
		}

		for (x = 0; x < 256; ++x) {
			colorMap[x] = -2;
		}

		/* First find bounding box of changed areas. */
		/* first find the top changed row */
		for (y = 0; y < tim->sy; ++y) {
			for (x = 0; x < tim->sx; ++x) {
				if (!comparewithmap(prev_tim, tim,
				                    prev_tim->pixels[y][x],
				                    tim->pixels[y][x],
				                    colorMap)) {
					min_y = max_y = y;
					min_x = max_x = x;
					goto break_top;
				}
			}
		}

break_top:
		if (tim->sy == min_y) {
			/* No changes in this frame!! Encode empty image. */
			transparent = 0;
			min_x = min_y = 1;
			max_x = max_y = 0;
		} else {
			/* Then the bottom row */
			for (y = tim->sy - 1; y > min_y; --y) {
				for (x = 0; x < tim->sx; ++x) {
					if (!comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[y][x],
					         tim->pixels[y][x],
					         colorMap)) {
						max_y = y;
						if(x < min_x) {
							min_x = x;
						}
						if(x > max_x) {
							max_x = x;
						}
						goto break_bot;
					}
				}
			}

break_bot:
			/* left side */
			for (x = 0; x < min_x; ++x) {
				for (y = min_y; y <= max_y; ++y) {
					if (!comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[y][x],
					         tim->pixels[y][x],
					         colorMap)) {
						min_x = x;
						goto break_left;
					}
				}
			}

break_left:
			/* right side */
			for (x = tim->sx - 1; x > max_x; --x) {
				for (y = min_y; y <= max_y; ++y) {
					if (!comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[y][x],
					         tim->pixels[y][x],
					         colorMap)) {
						max_x = x;
						goto break_right;
					}
				}
			}

break_right:
			;
		}

		LeftOfs = min_x;
		TopOfs = min_y;
		Disposal = 1;

		/* Make a copy of the image with the new offsets.
		   But only if necessary. */
		if (min_x != 0 || max_x != tim->sx - 1
		        || min_y != 0 || max_y != tim->sy - 1
		        || transparent >= 0) {

			gdImagePtr pim2 = gdImageCreate(max_x-min_x + 1, max_y-min_y + 1);

			if (!pim2) {
				if (prev_pim) {
					gdImageDestroy(prev_pim);
				}
				goto fail_end;
			}

			gdImagePaletteCopy(pim2, LocalCM ? tim : prev_tim);
			gdImageCopy(pim2, tim, 0, 0, min_x, min_y,
			            max_x - min_x + 1, max_y - min_y + 1);

			if (pim) {
				gdImageDestroy(pim);
			}

			tim = pim = pim2;
		}

		/* now let's compare pixels for transparent
		   optimization.  But only if transparent is set. */
		if (transparent >= 0) {
			for(y = 0; y < tim->sy; ++y) {
				for (x = 0; x < tim->sx; ++x) {
					if(comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[min_y + y][min_x + x],
					         tim->pixels[y][x], 0)) {
						gdImageSetPixel(tim, x, y, transparent);
						break;
					}
				}
			}
		}

		if(prev_pim) {
			gdImageDestroy(prev_pim);
		}
	}

	BitsPerPixel = colorstobpp(tim->colorsTotal);

	/* All set, let's do it. */
	GIFAnimEncode(
	    out, tim->sx, tim->sy, LeftOfs, TopOfs, interlace, transparent,
	    Delay, Disposal, BitsPerPixel,
	    LocalCM ? tim->red : 0, tim->green, tim->blue, tim);

fail_end:
	if(pim) {
		/* Destroy palette based temporary image. */
		gdImageDestroy(pim);
	}
}